

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

void __thiscall
Problem_CGBG_FF::Problem_CGBG_FF
          (Problem_CGBG_FF *this,size_t nrHouses,size_t nrFLs,size_t nrAgents,
          size_t nrActionsPerAgent,size_t nrObservedHousesPerAgent,size_t k)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  pointer pvVar2;
  pointer pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  Index agI;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  string local_d8;
  allocator_type local_aa;
  allocator_type local_a9;
  string local_a8;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_70;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_58;
  vector<Scope,_std::allocator<Scope>_> *local_50;
  vector<Scope,_std::allocator<Scope>_> *local_48;
  size_t local_40;
  value_type_conflict2 local_38;
  undefined1 extraout_var_01 [56];
  
  auVar13 = in_ZMM1._0_16_;
  auVar11 = in_ZMM0._0_16_;
  local_40 = nrActionsPerAgent;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,nrAgents,&local_40,
             &local_a9);
  auVar11 = vcvtusi2sd_avx512f(auVar11,nrFLs);
  auVar13 = vcvtusi2sd_avx512f(auVar13,nrObservedHousesPerAgent);
  auVar12._0_8_ = pow(auVar11._0_8_,auVar13._0_8_);
  auVar12._8_56_ = extraout_var_01;
  local_38 = vcvttsd2usi_avx512f(auVar12._0_16_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,nrAgents,&local_38,
             &local_aa);
  BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
            (&this->super_BayesianGameCollaborativeGraphical,nrAgents,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  if (local_a8._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_a8._M_dataplus._M_p,
                    local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
  }
  if (local_d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  (this->super_BayesianGameCollaborativeGraphical).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__Problem_CGBG_FF_005a81e8;
  local_68 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_allAgents;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_nrHouses = nrHouses;
  this->_m_nrFireLevels = nrFLs;
  this->_m_nrObsPerHouse = nrFLs;
  this->_m_nrActionsPerAgent = local_40;
  this->_m_nrObservedHousesPerAgents = nrObservedHousesPerAgent;
  this->_m_k = k;
  this->_m_maxNrAgentsObservingAHouse = k;
  p_Var1 = &(this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_m_Norm_cache)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_m_Norm_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &this->_m_agentsForHouse_action;
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            (local_48,nrHouses,(value_type *)&local_d8,(allocator_type *)&local_a8);
  if (local_d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  local_50 = &this->_m_agentsForHouse_obs;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            (local_50,nrHouses,(value_type *)&local_d8,(allocator_type *)&local_a8);
  if (local_d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  local_58 = &this->_m_houseIndices_obs;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(local_58,nrAgents,(value_type *)&local_d8,(allocator_type *)&local_a8);
  if (local_d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  local_70 = &this->_m_houseIndices_action;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(local_70,nrAgents,(value_type *)&local_d8,(allocator_type *)&local_a8);
  if (local_d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  local_78 = &this->_m_housePositionX;
  local_d8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_78,nrHouses,(value_type_conflict3 *)&local_d8,(allocator_type *)&local_a8);
  local_80 = &this->_m_housePositionY;
  local_d8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_80,nrHouses,(value_type_conflict3 *)&local_d8,(allocator_type *)&local_a8);
  local_88 = &this->_m_agentPositionX;
  local_d8._M_dataplus._M_p = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_88,nrAgents,(value_type_conflict3 *)&local_d8,(allocator_type *)&local_a8);
  local_60 = &this->_m_agentPositionY;
  local_d8._M_dataplus._M_p = (char *)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (local_60,nrAgents,(value_type_conflict3 *)&local_d8,(allocator_type *)&local_a8);
  uVar9 = 0;
  while( true ) {
    iVar5 = (*(this->super_BayesianGameCollaborativeGraphical).
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    uVar10 = (uint)uVar9;
    if (CONCAT44(extraout_var,iVar5) <= uVar9) break;
    local_d8._M_dataplus._M_p._0_4_ = uVar10;
    __position._M_current =
         (this->_m_allAgents).super_SDT.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_m_allAgents).super_SDT.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (local_68,__position,(uint *)&local_d8);
    }
    else {
      *__position._M_current = uVar10;
      (this->_m_allAgents).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar9 = (ulong)(uVar10 + 1);
  }
  ScatterHouses(this);
  ScatterAgents(this);
  AssignAgentActionsToHouses(this);
  AssignAgentTypesToHouses(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Assignment summary:",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  uVar10 = 0;
  while( true ) {
    iVar5 = (*(this->super_BayesianGameCollaborativeGraphical).
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    uVar9 = (ulong)uVar10;
    if (CONCAT44(extraout_var_00,iVar5) <= uVar9) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Agent ",6);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"...\n\tcan fight fire at houses:",0x1e);
    pvVar2 = (this->_m_houseIndices_action).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->_m_houseIndices_action).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (uVar7 < uVar9 || uVar7 - uVar9 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
    }
    PrintTools::SoftPrintVector<unsigned_int>(&local_d8,pvVar2 + uVar9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tand can observe houses:",0x19);
    pvVar2 = (this->_m_houseIndices_obs).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->_m_houseIndices_obs).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (uVar7 < uVar9 || uVar7 - uVar9 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
    }
    PrintTools::SoftPrintVector<unsigned_int>(&local_a8,pvVar2 + uVar9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    uVar10 = uVar10 + 1;
  }
  if (this->_m_nrHouses != 0) {
    uVar9 = 0;
    uVar7 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"House ",6);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"...\n\tcan be visited by agents :",0x1f);
      pSVar3 = (this->_m_agentsForHouse_action).super__Vector_base<Scope,_std::allocator<Scope>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->_m_agentsForHouse_action).
                     super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x5555555555555555;
      if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
LAB_00392442:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                  );
      }
      poVar6 = ::operator<<(poVar6,pSVar3 + uVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\n\tand by observed by agents:",0x1c);
      pSVar3 = (this->_m_agentsForHouse_obs).super__Vector_base<Scope,_std::allocator<Scope>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->_m_agentsForHouse_obs).super__Vector_base<Scope,_std::allocator<Scope>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) *
              -0x5555555555555555;
      if (uVar8 < uVar9 || uVar8 - uVar9 == 0) goto LAB_00392442;
      poVar6 = ::operator<<(poVar6,pSVar3 + uVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      bVar4 = uVar7 < this->_m_nrHouses;
      uVar9 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if (this->_m_nrHouses != 0) {
    uVar9 = 0;
    do {
      AddEdge(this,(Index)uVar9);
      uVar9 = (ulong)((Index)uVar9 + 1);
    } while (uVar9 < this->_m_nrHouses);
  }
  return;
}

Assistant:

Problem_CGBG_FF::Problem_CGBG_FF(
                size_t nrHouses,
                size_t nrFLs,
                size_t nrAgents,
                size_t nrActionsPerAgent,       //i.e., z
                size_t nrObservedHousesPerAgent,//i.e., y
                size_t k                        //the maximum number of agents in a house's payoff function

    )
    :
        BayesianGameCollaborativeGraphical(
                nrAgents, 
                vector<size_t>(nrAgents, nrActionsPerAgent),
#if USE_FLAMES_NOFLAMES_OBS
                vector<size_t>(nrAgents, pow(2, nrObservedHousesPerAgent))
#else
                vector<size_t>(nrAgents, pow(nrFLs, nrObservedHousesPerAgent))
#endif
                )
        ,_m_allAgents()
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
#if USE_FLAMES_NOFLAMES_OBS
        ,_m_nrObsPerHouse(2)
#else
        ,_m_nrObsPerHouse(nrFLs) // each firelevel is a type
#endif
        ,_m_nrActionsPerAgent(nrActionsPerAgent)
        ,_m_nrObservedHousesPerAgents(nrObservedHousesPerAgent)
        ,_m_k(k)
        //this means that there is no limit on how many agents can observe a house:
        //,_m_maxNrAgentsObservingAHouse(nrAgents)
        ,_m_maxNrAgentsObservingAHouse(k)//<-this means that there is no limit on how many agents can observe a house
        ,_m_Norm_cache()
        ,_m_agentsForHouse_action(nrHouses, Scope())
        ,_m_agentsForHouse_obs(nrHouses, Scope())
        ,_m_houseIndices_obs(nrAgents, vector<Index>() )
        ,_m_houseIndices_action(nrAgents, vector<Index>() )
        ,_m_housePositionX(nrHouses, -1.0)
        ,_m_housePositionY(nrHouses, -1.0)
        ,_m_agentPositionX(nrAgents, -1.0)
        ,_m_agentPositionY(nrAgents, -1.0)


{
    //cout << "Problem_CGBG_FF::constructor...\n";
    //cout << "nrFLs=" << nrFLs;
    //cout << "\nnrObservedHousesPerAgent="<<nrObservedHousesPerAgent;
    //cout << "\nnr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        _m_allAgents.Insert(agI);
    ScatterHouses();
    ScatterAgents();
    AssignAgentActionsToHouses();
    AssignAgentTypesToHouses();

    //print summarization of assignment:
    cout << "-------------------"<<endl;
    cout << "Assignment summary:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        cout << "Agent "<<agI<<"...\n\tcan fight fire at houses:"<<
        SoftPrintVector(_m_houseIndices_action.at(agI)) <<
        "\n\tand can observe houses:" <<
        SoftPrintVector(_m_houseIndices_obs.at(agI)) << endl;
    }
#if DEBUGASSIGN
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        cout << "House "<<hI<<"...\n\tcan be visited by agents :"<<
        _m_agentsForHouse_action.at(hI) <<
        "\n\tand by observed by agents:" <<
        _m_agentsForHouse_obs.at(hI) << endl;
    }
#endif
    cout << "-------------------"<<endl;


    //can we do an automatic reduction? I.e., when same scopes, the 
    //edges are combined ? 
    //Would that be something we would want? (perhaps not? the number of edges becomes variable)
    for(Index hI=0; hI < _m_nrHouses; hI++)
        AddEdge(hI);

}